

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_dynamic.cpp
# Opt level: O3

void multikey_dynamic<vector_bagwell<unsigned_char*,16u>,unsigned_short>
               (uchar **strings,size_t N,size_t depth)

{
  uchar *puVar1;
  pointer pppuVar2;
  pointer pppuVar3;
  unsigned_short uVar4;
  uint j;
  long lVar5;
  ulong uVar6;
  ushort uVar7;
  size_t N_00;
  size_t sVar8;
  uint j_1;
  size_t N_01;
  long lVar9;
  uchar **ppuVar10;
  uchar **__dest;
  uchar **ppuVar11;
  size_t N_02;
  ulong uVar12;
  array<vector_bagwell<unsigned_char_*,_16U>,_3UL> buckets;
  array<unsigned_short,_32UL> cache;
  vector_bagwell<unsigned_char_*,_16U> local_f8;
  vector_bagwell<unsigned_char_*,_16U> vStack_d0;
  vector_bagwell<unsigned_char_*,_16U> local_a8;
  pointer local_80;
  uchar **local_78;
  ushort auStack_70 [32];
  
  if (N < 10000) {
    mkqsort(strings,(int)N,(int)depth);
    return;
  }
  local_a8._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._insertpos = (uchar **)0x0;
  local_a8._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_d0._insertpos = (uchar **)0x0;
  vStack_d0._left_in_block = 0;
  vStack_d0._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_d0._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8._left_in_block = 0;
  vStack_d0._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8._insertpos = (uchar **)0x0;
  local_f8._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._left_in_block = 0;
  uVar4 = pseudo_median<unsigned_short>(strings,N,depth);
  if ((N & 0xffffffffffffffe0) == 0) {
    uVar12 = 0;
  }
  else {
    uVar12 = 0;
    ppuVar10 = strings;
    do {
      lVar5 = 0;
      do {
        puVar1 = ppuVar10[lVar5];
        if (puVar1 == (uchar *)0x0) goto LAB_001b6cdd;
        if (puVar1[depth] == '\0') {
          uVar7 = 0;
        }
        else {
          uVar7 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
        }
        auStack_70[lVar5] = uVar7;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x20);
      lVar5 = 0;
      ppuVar11 = ppuVar10;
      do {
        vector_bagwell<unsigned_char_*,_16U>::push_back
                  (&local_f8 +
                   (ulong)(auStack_70[lVar5] == uVar4) + (ulong)(uVar4 < auStack_70[lVar5]) * 2,
                   ppuVar11);
        lVar5 = lVar5 + 1;
        ppuVar11 = ppuVar11 + 1;
      } while (lVar5 != 0x20);
      uVar12 = uVar12 + 0x20;
      ppuVar10 = ppuVar10 + 0x20;
    } while (uVar12 < (N & 0xffffffffffffffe0));
  }
  lVar5 = N - uVar12;
  if (uVar12 <= N && lVar5 != 0) {
    ppuVar10 = strings + uVar12;
    do {
      puVar1 = *ppuVar10;
      if (puVar1 == (uchar *)0x0) {
LAB_001b6cdd:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar1[depth] == '\0') {
        uVar7 = 0;
      }
      else {
        uVar7 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
      }
      vector_bagwell<unsigned_char_*,_16U>::push_back
                (&local_f8 + (ulong)(uVar7 == uVar4) + (ulong)(uVar4 < uVar7) * 2,ppuVar10);
      ppuVar10 = ppuVar10 + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  ppuVar11 = local_a8._insertpos;
  ppuVar10 = local_f8._insertpos;
  pppuVar2 = local_f8._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (local_f8._insertpos == (uchar **)0x0) {
    N_01 = 0;
  }
  else {
    N_01 = (long)local_f8._insertpos +
           ((long)((1 << ((char)((uint)((int)local_f8._index_block.
                                             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (int)local_f8._index_block.
                                            super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) + 3U &
                         0x1f)) + -0x10) * 8 -
           (long)local_f8._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1]) >> 3;
  }
  if (vStack_d0._insertpos == (uchar **)0x0) {
    N_02 = 0;
  }
  else {
    N_02 = (long)vStack_d0._insertpos +
           ((long)((1 << ((char)((uint)((int)vStack_d0._index_block.
                                             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (int)vStack_d0._index_block.
                                            super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) + 3U &
                         0x1f)) + -0x10) * 8 -
           (long)vStack_d0._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1]) >> 3;
  }
  if (local_a8._insertpos == (uchar **)0x0) {
    N_00 = 0;
  }
  else {
    N_00 = (long)local_a8._insertpos +
           ((long)((1 << ((char)((uint)((int)local_a8._index_block.
                                             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (int)local_a8._index_block.
                                            super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) + 3U &
                         0x1f)) + -0x10) * 8 -
           (long)local_a8._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1]) >> 3;
  }
  if (N_02 + N_01 + N_00 != N) {
    __assert_fail("bucketsize0 + bucketsize1 + bucketsize2 == N",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_dynamic.cpp"
                  ,0x5d,
                  "void multikey_dynamic(unsigned char **, size_t, size_t) [BucketT = vector_bagwell<unsigned char *>, CharT = unsigned short]"
                 );
  }
  local_78 = vStack_d0._insertpos;
  if (N_01 != 0) {
    local_80 = local_f8._index_block.
               super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
               super__Vector_impl_data._M_finish;
    __dest = strings;
    if (8 < (ulong)((long)local_f8._index_block.
                          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_f8._index_block.
                         super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                         _M_impl.super__Vector_impl_data._M_start)) {
      uVar6 = (long)local_f8._index_block.
                    super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_f8._index_block.
                    super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      uVar12 = 2;
      if (2 < uVar6) {
        uVar12 = uVar6;
      }
      lVar5 = 0x10;
      lVar9 = 0;
      do {
        if (lVar5 != 0) {
          memmove(__dest,pppuVar2[lVar9],lVar5 * 8);
        }
        __dest = __dest + lVar5;
        lVar5 = lVar5 * 2;
        lVar9 = lVar9 + 1;
      } while (uVar12 - 1 != lVar9);
    }
    sVar8 = (long)ppuVar10 - (long)local_80[-1];
    if (sVar8 != 0) {
      memmove(__dest,local_80[-1],sVar8);
    }
  }
  pppuVar3 = vStack_d0._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pppuVar2 = vStack_d0._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (N_02 != 0) {
    ppuVar10 = strings + N_01;
    if (8 < (ulong)((long)vStack_d0._index_block.
                          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)vStack_d0._index_block.
                         super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                         _M_impl.super__Vector_impl_data._M_start)) {
      uVar6 = (long)vStack_d0._index_block.
                    super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)vStack_d0._index_block.
                    super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      uVar12 = 2;
      if (2 < uVar6) {
        uVar12 = uVar6;
      }
      lVar5 = 0x10;
      lVar9 = 0;
      do {
        if (lVar5 != 0) {
          memmove(ppuVar10,pppuVar2[lVar9],lVar5 * 8);
        }
        ppuVar10 = ppuVar10 + lVar5;
        lVar5 = lVar5 * 2;
        lVar9 = lVar9 + 1;
      } while (uVar12 - 1 != lVar9);
    }
    sVar8 = (long)local_78 - (long)pppuVar3[-1];
    if (sVar8 != 0) {
      memmove(ppuVar10,pppuVar3[-1],sVar8);
    }
  }
  pppuVar3 = local_a8._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pppuVar2 = local_a8._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (N_00 != 0) {
    ppuVar10 = strings + N_01 + N_02;
    if (8 < (ulong)((long)local_a8._index_block.
                          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_a8._index_block.
                         super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                         _M_impl.super__Vector_impl_data._M_start)) {
      uVar6 = (long)local_a8._index_block.
                    super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_a8._index_block.
                    super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      uVar12 = 2;
      if (2 < uVar6) {
        uVar12 = uVar6;
      }
      lVar5 = 0x10;
      lVar9 = 0;
      do {
        if (lVar5 != 0) {
          memmove(ppuVar10,pppuVar2[lVar9],lVar5 * 8);
        }
        ppuVar10 = ppuVar10 + lVar5;
        lVar5 = lVar5 * 2;
        lVar9 = lVar9 + 1;
      } while (uVar12 - 1 != lVar9);
    }
    sVar8 = (long)ppuVar11 - (long)pppuVar3[-1];
    if (sVar8 != 0) {
      memmove(ppuVar10,pppuVar3[-1],sVar8);
    }
  }
  vector_bagwell<unsigned_char_*,_16U>::clear(&local_f8);
  vector_bagwell<unsigned_char_*,_16U>::clear(&vStack_d0);
  vector_bagwell<unsigned_char_*,_16U>::clear(&local_a8);
  multikey_dynamic<vector_bagwell<unsigned_char*,16u>,unsigned_short>(strings,N_01,depth);
  if ((char)uVar4 != '\0') {
    multikey_dynamic<vector_bagwell<unsigned_char*,16u>,unsigned_short>
              (strings + N_01,N_02,depth + 2);
  }
  multikey_dynamic<vector_bagwell<unsigned_char*,16u>,unsigned_short>
            (strings + N_01 + N_02,N_00,depth);
  lVar5 = 0x50;
  do {
    vector_bagwell<unsigned_char_*,_16U>::~vector_bagwell
              ((vector_bagwell<unsigned_char_*,_16U> *)
               ((long)&local_f8._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar5));
    lVar5 = lVar5 + -0x28;
  } while (lVar5 != -0x28);
  return;
}

Assistant:

static void
multikey_dynamic(unsigned char** strings, size_t N, size_t depth)
{
	if (N < 10000) {
		mkqsort(strings, N, depth);
		return;
	}
	std::array<BucketT, 3> buckets;
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < N-N%32; i+=32) {
		std::array<CharT, 32> cache;
		for (unsigned j=0; j<32; ++j) {
			cache[j] = get_char<CharT>(strings[i+j], depth);
		}
		for (unsigned j=0; j<32; ++j) {
			const unsigned b = get_bucket(cache[j], partval);
			buckets[b].push_back(strings[i+j]);
		}
	}
	for (; i < N; ++i) {
		const CharT c = get_char<CharT>(strings[i], depth);
		const unsigned b = get_bucket(c, partval);
		buckets[b].push_back(strings[i]);
	}
	const size_t bucketsize0 = buckets[0].size();
	const size_t bucketsize1 = buckets[1].size();
	const size_t bucketsize2 = buckets[2].size();
	assert(bucketsize0 + bucketsize1 + bucketsize2 == N);
	if (bucketsize0) copy(buckets[0], strings);
	if (bucketsize1) copy(buckets[1], strings+bucketsize0);
	if (bucketsize2) copy(buckets[2], strings+bucketsize0+bucketsize1);
	clear_bucket(buckets[0]);
	clear_bucket(buckets[1]);
	clear_bucket(buckets[2]);
	multikey_dynamic<BucketT, CharT>(strings, bucketsize0, depth);
	if (not is_end(partval))
		multikey_dynamic<BucketT, CharT>(strings+bucketsize0,
				bucketsize1, depth+sizeof(CharT));
	multikey_dynamic<BucketT, CharT>(strings+bucketsize0+bucketsize1,
			bucketsize2, depth);
}